

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

double ON_Length3d(double x,double y,double z)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double local_28;
  double len;
  double z_local;
  double y_local;
  double x_local;
  
  dVar1 = ABS(x);
  dVar2 = ABS(y);
  dVar3 = ABS(z);
  len = dVar3;
  if ((((dVar2 < dVar1) || (z_local = dVar1, y_local = dVar2, dVar2 < dVar3)) &&
      (z_local = dVar2, y_local = dVar1, dVar1 <= dVar3)) && (dVar2 <= dVar3)) {
    len = dVar1;
    y_local = dVar3;
  }
  if (y_local <= 2.2250738585072014e-308) {
    if ((y_local <= 0.0) || ((y_local._6_2_ & 0x7ff0) == 0x7ff0)) {
      local_28 = 0.0;
    }
    else {
      local_28 = y_local;
    }
  }
  else {
    local_28 = sqrt((len / y_local) * (len / y_local) +
                    (z_local / y_local) * (z_local / y_local) + 1.0);
    local_28 = y_local * local_28;
  }
  return local_28;
}

Assistant:

double ON_Length3d(double x, double y, double z)
{
  double len;
  x = fabs(x);
  y = fabs(y);
  z = fabs(z);
  if ( y >= x && y >= z ) {
    len = x; x = y; y = len;
  }
  else if ( z >= x && z >= y ) {
    len = x; x = z; z = len;
  }

  // 15 September 2003 Dale Lear
  //     For small denormalized doubles (positive but smaller
  //     than DBL_MIN), some compilers/FPUs set 1.0/x to +INF.
  //     Without the ON_DBL_MIN test we end up with
  //     microscopic vectors that have infinite length!
  //
  //     This code is absolutely necessary.  It is a critical
  //     part of the bug fix for RR 11217.
  if ( x > ON_DBL_MIN ) 
  {
    y /= x;
    z /= x;
    len = x*sqrt(1.0 + y*y + z*z);
  }
  else if ( x > 0.0 && ON_IS_FINITE(x) )
    len = x;
  else
    len = 0.0;

  return len;
}